

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O2

void icu_63::Hangul::getRawDecomposition(UChar32 c,UChar *buffer)

{
  short sVar1;
  int iVar2;
  UChar UVar3;
  UChar32 orig;
  int iVar4;
  
  iVar4 = c + -0xac00;
  iVar2 = iVar4 % 0x1c;
  if (iVar2 == 0) {
    UVar3 = (short)(iVar4 / 0x24c) + L'ᄀ';
    iVar2 = (int)((long)((ulong)(uint)((int)((long)iVar4 / 0x1c) >> 0x1f) << 0x20 |
                        (long)iVar4 / 0x1c & 0xffffffffU) % 0x15);
    sVar1 = 0x1161;
  }
  else {
    UVar3 = (short)c - (short)iVar2;
    sVar1 = 0x11a7;
  }
  *buffer = UVar3;
  buffer[1] = sVar1 + (short)iVar2;
  return;
}

Assistant:

static inline void getRawDecomposition(UChar32 c, UChar buffer[2]) {
        UChar32 orig=c;
        c-=HANGUL_BASE;
        UChar32 c2=c%JAMO_T_COUNT;
        if(c2==0) {
            c/=JAMO_T_COUNT;
            buffer[0]=(UChar)(JAMO_L_BASE+c/JAMO_V_COUNT);
            buffer[1]=(UChar)(JAMO_V_BASE+c%JAMO_V_COUNT);
        } else {
            buffer[0]=(UChar)(orig-c2);  // LV syllable
            buffer[1]=(UChar)(JAMO_T_BASE+c2);
        }
    }